

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScaleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RepeatedField<unsigned_long> *pRVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  string *psVar7;
  uint64_t outChannels;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  char cVar11;
  bool bVar12;
  LayerUnion LVar13;
  undefined8 *puVar14;
  unsigned_long *puVar15;
  long *plVar16;
  uint uVar17;
  WeightParams *pWVar18;
  size_type *psVar19;
  ulong *puVar20;
  char cVar21;
  ulong uVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  uint uVar25;
  uint64_t uVar26;
  int i;
  int iVar27;
  uint __len;
  string err;
  Result r;
  string err_2;
  string local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  undefined1 local_d8 [24];
  string local_c0;
  string local_a0;
  WeightParams *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  unsigned_long local_58;
  string local_50;
  
  Result::Result((Result *)&local_110);
  validateInputCount((Result *)local_e8,layer,1,1);
  local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
  if (local_e0._M_p != local_d8 + 8) {
    operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
  }
  bVar10 = Result::good((Result *)&local_110);
  if (bVar10) {
    validateOutputCount((Result *)local_e8,layer,1,1);
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
    if (local_e0._M_p != local_d8 + 8) {
      operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
    }
  }
  bVar10 = Result::good((Result *)&local_110);
  if (bVar10) {
    if (this->ndArrayInterpretation != true) {
LAB_002c25a6:
      if (layer->_oneof_case_[0] == 0xf5) {
        LVar13 = layer->layer_;
      }
      else {
        LVar13.scale_ = Specification::ScaleLayerParams::default_instance();
      }
      pWVar18 = (LVar13.scale_)->scale_;
      if (pWVar18 == (WeightParams *)0x0) {
        pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar27 = (pWVar18->floatvalue_).current_size_;
      sVar4 = ((pWVar18->float16value_).ptr_)->_M_string_length;
      uVar25 = (0 < iVar27) + 1;
      if (sVar4 == 0) {
        uVar25 = (uint)(0 < iVar27);
      }
      sVar5 = ((pWVar18->rawvalue_).ptr_)->_M_string_length;
      sVar6 = ((pWVar18->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar6 == 0);
      uVar25 = (uVar25 - (sVar5 == 0)) + 2;
      cVar11 = '\x04';
      if (uVar25 - uVar8 < 2) {
        cVar11 = '\x05';
        if (uVar25 != uVar8) {
          cVar11 = iVar27 < 1;
        }
        if (((((sVar4 == 0) && (iVar27 < 1)) && (uVar25 != uVar8)) &&
            (((sVar5 == 0 ||
              (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar11 = '\x02', pWVar18->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar6 == 0 ||
             (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (cVar11 = '\x03', pWVar18->quantization_ == (QuantizationParams *)0x0)))) {
          cVar11 = '\x05';
        }
      }
      pWVar18 = (LVar13.scale_)->bias_;
      if (pWVar18 == (WeightParams *)0x0) {
        pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar27 = (pWVar18->floatvalue_).current_size_;
      sVar4 = ((pWVar18->float16value_).ptr_)->_M_string_length;
      uVar25 = (0 < iVar27) + 1;
      if (sVar4 == 0) {
        uVar25 = (uint)(0 < iVar27);
      }
      sVar5 = ((pWVar18->rawvalue_).ptr_)->_M_string_length;
      sVar6 = ((pWVar18->int8rawvalue_).ptr_)->_M_string_length;
      uVar8 = (uint)(sVar6 == 0);
      uVar25 = (uVar25 - (sVar5 == 0)) + 2;
      cVar21 = '\x04';
      if (uVar25 - uVar8 < 2) {
        cVar21 = '\x05';
        if (uVar25 != uVar8) {
          cVar21 = iVar27 < 1;
        }
        if (((((sVar4 == 0) && (iVar27 < 1)) && (uVar25 != uVar8)) &&
            (((sVar5 == 0 ||
              (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar21 = '\x02', pWVar18->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar6 == 0 ||
             (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (cVar21 = '\x03', pWVar18->quantization_ == (QuantizationParams *)0x0)))) {
          cVar21 = '\x05';
        }
      }
      if ((cVar11 == '\x04') ||
         (bVar10 = (LVar13.scale_)->hasbias_, (cVar21 == '\x04' & bVar10) != 0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,"Scale layer \'",(layer->name_).ptr_);
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_e8);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar19 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_130.field_2._M_allocated_capacity = *psVar19;
          local_130.field_2._8_8_ = puVar14[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar19;
          local_130._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_130._M_string_length = puVar14[1];
        *puVar14 = psVar19;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        if (local_e8 != (undefined1  [8])local_d8) {
          operator_delete((void *)local_e8,local_d8._0_8_ + 1);
        }
        Result::Result((Result *)local_e8,INVALID_MODEL_PARAMETERS,&local_130);
LAB_002c2cac:
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8;
        std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
        if (local_e0._M_p != local_d8 + 8) {
          operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)__return_storage_ptr__ = local_110;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p == &local_f8) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_f8._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_108._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_100;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        uVar23 = local_130.field_2._M_allocated_capacity;
        _Var24._M_p = local_130._M_dataplus._M_p;
        local_108._M_p = (pointer)&local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_002c2f32;
      }
      else {
        if ((bVar10 != false) &&
           (((cVar11 == '\x01' && (cVar21 == '\0')) || ((cVar11 == '\0' && (cVar21 == '\x01')))))) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,"Scale layer \'",(layer->name_).ptr_);
          puVar14 = (undefined8 *)std::__cxx11::string::append(local_e8);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          psVar19 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_130.field_2._M_allocated_capacity = *psVar19;
            local_130.field_2._8_8_ = puVar14[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar19;
            local_130._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_130._M_string_length = puVar14[1];
          *puVar14 = psVar19;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          if (local_e8 != (undefined1  [8])local_d8) {
            operator_delete((void *)local_e8,local_d8._0_8_ + 1);
          }
          Result::Result((Result *)local_e8,INVALID_MODEL_PARAMETERS,&local_130);
          goto LAB_002c2cac;
        }
        pRVar2 = &(LVar13.convolution_)->kernelsize_;
        if ((((LVar13.convolution_)->kernelsize_).current_size_ | 2U) == 3) {
          uVar26 = 1;
          iVar27 = 0;
          do {
            puVar15 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,iVar27);
            uVar26 = uVar26 * *puVar15;
            iVar27 = iVar27 + 1;
          } while (iVar27 < pRVar2->current_size_);
          if (pRVar2->current_size_ == 3) {
            local_80 = (LVar13.scale_)->scale_;
            if (((LVar13.innerproduct_)->bias_->_internal_metadata_).
                super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                .ptr_ < (void *)0x2) goto LAB_002c2a0a;
            if (local_80 == (WeightParams *)0x0) {
              local_80 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            puVar15 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,0);
            local_58 = *puVar15;
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
            psVar7 = (layer->name_).ptr_;
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"scale","");
            validateGeneralWeightParams
                      ((Result *)local_e8,local_80,uVar26,local_58,&local_130,psVar7,&local_c0);
          }
          else {
            local_80 = (LVar13.scale_)->scale_;
LAB_002c2a0a:
            if (local_80 == (WeightParams *)0x0) {
              local_80 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
            psVar7 = (layer->name_).ptr_;
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"scale","");
            validateGeneralWeightParams
                      ((Result *)local_e8,local_80,uVar26,1,&local_130,psVar7,&local_c0);
          }
          local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8;
          std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
          if (local_e0._M_p != local_d8 + 8) {
            operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          bVar12 = Result::good((Result *)&local_110);
          if (!bVar12) goto LAB_002c2ee4;
          if (bVar10 == false) {
LAB_002c2eda:
            Result::Result(__return_storage_ptr__);
            goto LAB_002c2f32;
          }
          pRVar2 = &(LVar13.convolution_)->stride_;
          if ((((LVar13.convolution_)->stride_).current_size_ | 2U) == 3) {
            uVar26 = 1;
            iVar27 = 0;
            do {
              puVar15 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,iVar27);
              uVar26 = uVar26 * *puVar15;
              iVar27 = iVar27 + 1;
            } while (iVar27 < pRVar2->current_size_);
            if ((pRVar2->current_size_ == 3) &&
               (puVar15 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,0),
               1 < *puVar15)) {
              pWVar18 = (LVar13.scale_)->bias_;
              if (pWVar18 == (WeightParams *)0x0) {
                pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              puVar15 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,0);
              outChannels = *puVar15;
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
              psVar7 = (layer->name_).ptr_;
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bias","");
              validateGeneralWeightParams
                        ((Result *)local_e8,pWVar18,uVar26,outChannels,&local_130,psVar7,&local_c0);
              local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8;
              std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
              if (local_e0._M_p != local_d8 + 8) {
                operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_002c2ea0:
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              pWVar18 = (LVar13.scale_)->bias_;
              if (pWVar18 == (WeightParams *)0x0) {
                pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
              psVar7 = (layer->name_).ptr_;
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bias","");
              validateGeneralWeightParams
                        ((Result *)local_e8,pWVar18,uVar26,1,&local_130,psVar7,&local_c0);
              local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8;
              std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
              if (local_e0._M_p != local_d8 + 8) {
                operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_002c2ea0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = Result::good((Result *)&local_110);
            if (!bVar10) goto LAB_002c2ee4;
            goto LAB_002c2eda;
          }
          std::operator+(&local_78,"The bias vector for scale layer \'",(layer->name_).ptr_);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_78);
          puVar20 = (ulong *)(plVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar20) {
            local_c0.field_2._M_allocated_capacity = *puVar20;
            local_c0.field_2._8_8_ = plVar16[3];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *puVar20;
            local_c0._M_dataplus._M_p = (pointer)*plVar16;
          }
          local_c0._M_string_length = plVar16[1];
          *plVar16 = (long)puVar20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          std::__cxx11::to_string(&local_a0,pRVar2->current_size_);
          std::operator+(&local_130,&local_c0,&local_a0);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
          psVar19 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_d8._0_8_ = *psVar19;
            local_d8._8_8_ = puVar14[3];
            local_e8 = (undefined1  [8])local_d8;
          }
          else {
            local_d8._0_8_ = *psVar19;
            local_e8 = (undefined1  [8])*puVar14;
          }
          local_e0._M_p = (pointer)puVar14[1];
          *puVar14 = psVar19;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
          uVar23 = local_d8._0_8_;
          _Var24._M_p = (pointer)local_e8;
          if (local_e8 == (undefined1  [8])local_d8) goto LAB_002c2f32;
        }
        else {
          std::operator+(&local_78,"The shape vector for the scale layer \'",(layer->name_).ptr_);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_78);
          paVar1 = &local_c0.field_2;
          puVar20 = (ulong *)(plVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar20) {
            local_c0.field_2._M_allocated_capacity = *puVar20;
            local_c0.field_2._8_8_ = plVar16[3];
            local_c0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *puVar20;
            local_c0._M_dataplus._M_p = (pointer)*plVar16;
          }
          local_c0._M_string_length = plVar16[1];
          *plVar16 = (long)puVar20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          uVar25 = pRVar2->current_size_;
          uVar8 = -uVar25;
          if (0 < (int)uVar25) {
            uVar8 = uVar25;
          }
          __len = 1;
          if (9 < uVar8) {
            uVar22 = (ulong)uVar8;
            uVar9 = 4;
            do {
              __len = uVar9;
              uVar17 = (uint)uVar22;
              if (uVar17 < 100) {
                __len = __len - 2;
                goto LAB_002c2fce;
              }
              if (uVar17 < 1000) {
                __len = __len - 1;
                goto LAB_002c2fce;
              }
              if (uVar17 < 10000) goto LAB_002c2fce;
              uVar22 = uVar22 / 10000;
              uVar9 = __len + 4;
            } while (99999 < uVar17);
            __len = __len + 1;
          }
LAB_002c2fce:
          paVar3 = &local_a0.field_2;
          local_a0._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_a0,(char)__len - (char)((int)uVar25 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_a0._M_dataplus._M_p + (uVar25 >> 0x1f),__len,uVar8);
          uVar23 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            uVar23 = local_c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < local_a0._M_string_length + local_c0._M_string_length) {
            uVar23 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar3) {
              uVar23 = local_a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < local_a0._M_string_length + local_c0._M_string_length)
            goto LAB_002c305b;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0._M_dataplus._M_p);
          }
          else {
LAB_002c305b:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
          }
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          psVar19 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_130.field_2._M_allocated_capacity = *psVar19;
            local_130.field_2._8_8_ = puVar14[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar19;
            local_130._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_130._M_string_length = puVar14[1];
          *puVar14 = psVar19;
          puVar14[1] = 0;
          *(undefined1 *)psVar19 = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
          psVar19 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_d8._0_8_ = *psVar19;
            local_d8._8_8_ = puVar14[3];
            local_e8 = (undefined1  [8])local_d8;
          }
          else {
            local_d8._0_8_ = *psVar19;
            local_e8 = (undefined1  [8])*puVar14;
          }
          local_e0._M_p = (pointer)puVar14[1];
          *puVar14 = psVar19;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar3) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
          uVar23 = local_d8._0_8_;
          _Var24._M_p = (pointer)local_e8;
          if (local_e8 == (undefined1  [8])local_d8) goto LAB_002c2f32;
        }
      }
      operator_delete(_Var24._M_p,uVar23 + 1);
      goto LAB_002c2f32;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Scale","");
    validateInputOutputRankEquality((Result *)local_e8,layer,&local_50,&this->blobNameToRank);
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
    if (local_e0._M_p != local_d8 + 8) {
      operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar10 = Result::good((Result *)&local_110);
    if (bVar10) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
      validateRankCount((Result *)local_e8,layer,&local_130,3,-1,&this->blobNameToRank);
      local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8;
      std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
      if (local_e0._M_p != local_d8 + 8) {
        operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      bVar10 = Result::good((Result *)&local_110);
      if (bVar10) goto LAB_002c25a6;
    }
  }
LAB_002c2ee4:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_110;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p == &local_f8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_f8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_108._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_100;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
LAB_002c2f32:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,
                    CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScaleLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Scale", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Scale", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.scale();

    bool has_bias = params.hasbias();
    WeightParamType scaleValueType, biasValueType;
    scaleValueType = valueType(params.scale());
    biasValueType = valueType(params.bias());

    // Check for scale and bias value type. Only float32 or float16 parameters can be populated at any time.
    // Both bias and weights should have the same value types
    if ( (scaleValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Scale layer '" + layer.name() + "' has invalid scale/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((scaleValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (scaleValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            const std::string err = "Scale layer '" + layer.name() +
            "' has invalid scale/bias fields. Field value types should match and should either be half or full precision.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    // Checks scale shape and size
    if (!(params.shapescale_size() == 1 || params.shapescale_size() == 3)) { // check shape
        std::string err = "The shape vector for the scale layer '" + layer.name() + "' is " +
        std::to_string(params.shapescale_size()) + " dimensional but should be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_scale_shape = 1;
    for (int i = 0; i < params.shapescale_size(); i++) {
        total_scale_shape *= params.shapescale(i);
    }

    if (params.shapescale_size() == 3 && params.shapescale(0) > 1){
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, params.shapescale(0), "Scale", layer.name(), "scale");
    } else {
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, 1, "Scale", layer.name(), "scale");
    }
    if (!r.good()) return r;

    // Checks bias shape and size
    if (has_bias) {
        if (!(params.shapebias_size() == 1 || params.shapebias_size() == 3)) {
            std::string err = "The bias vector for scale layer '" + layer.name() + "' is " +
            std::to_string(params.shapebias_size()) + " dimensional but should be either 1D or 3D.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        size_t total_bias_shape = 1;
        for (int i = 0; i < params.shapebias_size(); i++) {
            total_bias_shape *= params.shapebias(i);
        }
        if (params.shapebias_size() == 3 && params.shapebias(0) > 1){
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, params.shapebias(0), "Scale", layer.name(), "bias");
        } else {
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, 1, "Scale", layer.name(), "bias");
        }
        if (!r.good()) return r;
    }
    return Result();
}